

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool removeEmpty,bool replaceAt)

{
  undefined1 *puVar1;
  char cVar2;
  t_domain tVar3;
  cmState *this_00;
  ulong uVar4;
  cmake *this_01;
  __type _Var5;
  bool bVar6;
  int iVar7;
  cmState *pcVar8;
  size_t sVar9;
  char *pcVar10;
  undefined8 uVar11;
  ostream *poVar12;
  undefined7 in_register_00000009;
  cmState *pcVar13;
  cmState *pcVar14;
  byte bVar15;
  allocator local_329;
  string *local_328;
  uint local_31c;
  cmMakefile *local_318;
  MessageType local_30c;
  allocator local_306;
  allocator local_305;
  undefined4 local_304;
  string result;
  long local_2e0;
  vector<t_lookup,_std::allocator<t_lookup>_> openstack;
  string varresult_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string varresult;
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  long local_230;
  Snapshot *local_228;
  string *local_220;
  cmOutputConverter converter;
  string local_1e8;
  string local_1c8;
  string variable;
  
  local_304 = (undefined4)CONCAT71(in_register_00000009,escapeQuotes);
  pcVar14 = (cmState *)(source->_M_dataplus)._M_p;
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  local_328 = errorstr;
  local_220 = source;
  std::__cxx11::string::reserve((ulong)&result);
  local_2e0 = line;
  openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this_00 = this->GlobalGenerator->CMakeInstance->State;
  bVar15 = *(byte *)&(pcVar14->PropertyDefinitions)._M_t._M_impl;
  local_228 = &this->StateSnapshot;
  local_30c = LOG;
  local_31c = 0;
  pcVar13 = pcVar14;
  local_318 = this;
  do {
    if (bVar15 == 10) {
      local_2e0 = local_2e0 + 1;
    }
    else if (bVar15 == 0x24) {
      if (atOnly) {
LAB_003446db:
        if (!noEscapes) {
          puVar1 = &(pcVar13->PropertyDefinitions)._M_t._M_impl.field_0x1;
          cVar2 = (pcVar13->PropertyDefinitions)._M_t._M_impl.field_0x1;
          if (cVar2 == ';') {
            if (openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
                super__Vector_impl_data._M_start !=
                openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
                super__Vector_impl_data._M_finish) {
LAB_0034488a:
              iVar7 = isalnum((int)cVar2);
              if ((cVar2 == '\0') || (iVar7 != 0)) {
                uVar11 = std::__cxx11::string::append((char *)local_328);
                if (cVar2 != '\0') {
                  uVar11 = std::__cxx11::string::push_back((char)local_328);
                }
                local_31c = (uint)CONCAT71((int7)((ulong)uVar11 >> 8),1);
                std::__cxx11::string::append((char *)local_328);
              }
              else {
                std::__cxx11::string::append((char *)&result,(ulong)pcVar14);
                pcVar14 = (cmState *)puVar1;
              }
            }
          }
          else {
            if (cVar2 == 'n') {
              std::__cxx11::string::append((char *)&result,(ulong)pcVar14);
              std::__cxx11::string::append((char *)&result);
            }
            else if (cVar2 == 'r') {
              std::__cxx11::string::append((char *)&result,(ulong)pcVar14);
              std::__cxx11::string::append((char *)&result);
            }
            else {
              if (cVar2 != 't') goto LAB_0034488a;
              std::__cxx11::string::append((char *)&result,(ulong)pcVar14);
              std::__cxx11::string::append((char *)&result);
            }
            pcVar14 = (cmState *)&(pcVar13->PropertyDefinitions)._M_t._M_impl.field_0x2;
          }
          if (*(char *)&(pcVar14->PropertyDefinitions)._M_t._M_impl != '\0') {
            pcVar13 = (cmState *)puVar1;
          }
        }
      }
      else {
        uVar4 = (ulong)varresult_1._M_dataplus._M_p >> 0x20;
        varresult_1._M_dataplus._M_p = (pointer)(uVar4 << 0x20);
        varresult_1._M_string_length = 0;
        converter.StateSnapshot.State =
             (cmState *)&(pcVar13->PropertyDefinitions)._M_t._M_impl.field_0x1;
        cVar2 = (pcVar13->PropertyDefinitions)._M_t._M_impl.field_0x1;
        if (cVar2 == '\0') {
          std::__cxx11::string::append((char *)&result,(ulong)pcVar14);
          pcVar14 = converter.StateSnapshot.State;
        }
        else if (cVar2 != '<') {
          if (cVar2 == '{') {
            pcVar13 = (cmState *)&(pcVar13->PropertyDefinitions)._M_t._M_impl.field_0x2;
            varresult_1._M_dataplus._M_p = (pointer)(uVar4 << 0x20);
          }
          else {
            bVar6 = cmHasLiteralPrefix<char_const*,5ul>((char **)&converter,(char (*) [5])"ENV{");
            if (bVar6) {
              pcVar13 = (cmState *)&(pcVar13->PropertyDefinitions)._M_t._M_impl.field_0x5;
              varresult_1._M_dataplus._M_p._0_4_ = 1;
            }
            else {
              bVar6 = cmHasLiteralPrefix<char_const*,7ul>
                                ((char **)&converter,(char (*) [7])"CACHE{");
              if (!bVar6) {
                bVar6 = cmsys::RegularExpression::find
                                  (&this->cmNamedCurly,(char *)converter.StateSnapshot.State);
                if (bVar6) {
                  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_290,converter.StateSnapshot.State,
                             ((long)(local_318->cmNamedCurly).endp[0] -
                             (long)(local_318->cmNamedCurly).searchstring) +
                             (long)converter.StateSnapshot.State);
                  std::operator+(&varresult,"Syntax $",&local_290);
                  std::operator+(&variable,&varresult,
                                 "{} is not supported.  Only ${}, $ENV{}, and $CACHE{} are allowed."
                                );
                  std::__cxx11::string::operator=((string *)local_328,(string *)&variable);
                  std::__cxx11::string::~string((string *)&variable);
                  std::__cxx11::string::~string((string *)&varresult);
                  uVar11 = std::__cxx11::string::~string((string *)&local_290);
                  local_31c = (uint)CONCAT71((int7)((ulong)uVar11 >> 8),1);
                  local_30c = FATAL_ERROR;
                }
                goto LAB_00344ecb;
              }
              pcVar13 = (cmState *)&(pcVar13->PropertyDefinitions)._M_t._M_impl.field_0x7;
              varresult_1._M_dataplus._M_p._0_4_ = 2;
            }
          }
          std::__cxx11::string::append((char *)&result,(ulong)pcVar14);
          varresult_1._M_string_length = result._M_string_length;
          std::vector<t_lookup,_std::allocator<t_lookup>_>::push_back
                    (&openstack,(value_type *)&varresult_1);
          pcVar14 = pcVar13;
          pcVar13 = (cmState *)&pcVar13[-1].field_0x217;
        }
      }
    }
    else if (bVar15 == 0x40) {
      if (replaceAt) {
        puVar1 = &(pcVar13->PropertyDefinitions)._M_t._M_impl.field_0x1;
        pcVar8 = (cmState *)strchr(puVar1,0x40);
        if ((pcVar8 != (cmState *)puVar1 && pcVar8 != (cmState *)0x0) &&
           (sVar9 = strspn(puVar1,
                           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-"),
           pcVar8 == (cmState *)(puVar1 + sVar9))) {
          variable._M_dataplus._M_p = (pointer)&variable.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&variable,puVar1,puVar1 + ~(ulong)pcVar13 + (long)pcVar8);
          pcVar10 = GetSafeDefinition(local_318,&variable);
          std::__cxx11::string::string((string *)&varresult,pcVar10,(allocator *)&local_290);
          if ((char)local_304 != '\0') {
            cmSystemTools::EscapeQuotes(&local_290,&varresult);
            std::__cxx11::string::operator=((string *)&varresult,(string *)&local_290);
            std::__cxx11::string::~string((string *)&local_290);
          }
          std::__cxx11::string::append((char *)&result,(ulong)pcVar14);
          std::__cxx11::string::append((string *)&result);
          std::__cxx11::string::~string((string *)&varresult);
          std::__cxx11::string::~string((string *)&variable);
          pcVar14 = (cmState *)&(pcVar8->PropertyDefinitions)._M_t._M_impl.field_0x1;
          pcVar13 = pcVar8;
          goto LAB_00344ecb;
        }
      }
LAB_003445c0:
      if (((openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
            super__Vector_impl_data._M_start !=
            openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
            super__Vector_impl_data._M_finish) && (iVar7 = isalnum((int)(char)bVar15), iVar7 == 0))
         && ((0x34 < bVar15 - 0x2b ||
             ((0x1000000000001dU >> ((ulong)(bVar15 - 0x2b) & 0x3f) & 1) == 0)))) {
        std::__cxx11::string::append((char *)local_328);
        std::__cxx11::string::push_back((char)local_328);
        std::__cxx11::string::append((char *)&result,(ulong)pcVar14);
        std::__cxx11::string::substr((ulong)&local_290,(ulong)&result);
        std::operator+(&varresult,"\') in a variable name: \'",&local_290);
        std::operator+(&variable,&varresult,"\'");
        std::__cxx11::string::append((string *)local_328);
        std::__cxx11::string::~string((string *)&variable);
        std::__cxx11::string::~string((string *)&varresult);
        std::__cxx11::string::~string((string *)&local_290);
        goto LAB_00344f7f;
      }
    }
    else {
      if (bVar15 == 0x5c) goto LAB_003446db;
      if (bVar15 != 0x7d) {
        if (bVar15 != 0) goto LAB_003445c0;
        if ((local_31c & 1) != 0) goto LAB_00344f7f;
        break;
      }
      if (openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
          super__Vector_impl_data._M_start ==
          openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_00344ecb;
      tVar3 = openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].domain;
      uVar4 = openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].loc;
      openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
      super__Vector_impl_data._M_finish =
           openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      std::__cxx11::string::append((char *)&result,(ulong)pcVar14);
      std::__cxx11::string::substr((ulong)&local_290,(ulong)&result);
      varresult_1._M_dataplus._M_p = (pointer)&varresult_1.field_2;
      varresult_1._M_string_length = 0;
      varresult_1.field_2._M_local_buf[0] = '\0';
      if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
           ::lineVar_abi_cxx11_ == '\0') &&
         (iVar7 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                                       ::lineVar_abi_cxx11_), iVar7 != 0)) {
        std::__cxx11::string::string
                  ((string *)
                   &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                    ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE",(allocator *)&variable);
        __cxa_atexit(std::__cxx11::string::~string,
                     &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                      ::lineVar_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                             ::lineVar_abi_cxx11_);
      }
      if (tVar3 == NORMAL) {
        if ((filename == (char *)0x0) ||
           (_Var5 = std::operator==(&local_290,
                                    &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                                     ::lineVar_abi_cxx11_), !_Var5)) {
          pcVar10 = GetDefinition(local_318,&local_290);
          goto LAB_0034495f;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&variable);
        std::ostream::_M_insert<long>((long)&variable);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&varresult_1,(string *)&varresult);
        std::__cxx11::string::~string((string *)&varresult);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variable);
LAB_003449bd:
        if (((!removeEmpty) &&
            (local_318->GlobalGenerator->CMakeInstance->WarnUninitialized == true)) &&
           (bVar6 = cmState::Snapshot::IsInitialized(local_228,&local_290), !bVar6)) {
          if (local_318->CheckSystemVars == false) {
            std::__cxx11::string::string((string *)&variable,filename,(allocator *)&local_1c8);
            pcVar10 = GetHomeDirectory(local_318);
            std::__cxx11::string::string((string *)&varresult,pcVar10,&local_329);
            bVar6 = cmsys::SystemTools::IsSubDirectory(&variable,&varresult);
            if (bVar6) {
              std::__cxx11::string::~string((string *)&varresult);
              std::__cxx11::string::~string((string *)&variable);
            }
            else {
              std::__cxx11::string::string((string *)&converter,filename,&local_305);
              pcVar10 = GetHomeOutputDirectory(local_318);
              std::__cxx11::string::string((string *)&local_1e8,pcVar10,&local_306);
              bVar6 = cmsys::SystemTools::IsSubDirectory((string *)&converter,&local_1e8);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)&converter);
              std::__cxx11::string::~string((string *)&varresult);
              std::__cxx11::string::~string((string *)&variable);
              if (!bVar6) goto LAB_00344e8c;
            }
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&variable);
          varresult._M_dataplus._M_p = (pointer)&varresult.field_2;
          varresult._M_string_length = 0;
          varresult.field_2._M_local_buf[0] = '\0';
          local_250._M_p = (pointer)&local_240;
          local_248 = 0;
          local_240._M_local_buf[0] = '\0';
          local_230 = 0;
          cmOutputConverter::cmOutputConverter(&converter,*local_228);
          std::__cxx11::string::string((string *)&local_1c8,filename,&local_329);
          cmOutputConverter::Convert(&local_1e8,&converter,&local_1c8,HOME,UNCHANGED);
          std::__cxx11::string::operator=((string *)&local_250,(string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_1c8);
          local_230 = local_2e0;
          poVar12 = std::operator<<((ostream *)&variable,"uninitialized variable \'");
          poVar12 = std::operator<<(poVar12,(string *)&local_290);
          std::operator<<(poVar12,"\'");
          this_01 = local_318->GlobalGenerator->CMakeInstance;
          std::__cxx11::stringbuf::str();
          cmake::IssueMessage(this_01,AUTHOR_WARNING,&local_1e8,(cmListFileContext *)&varresult,
                              false);
          std::__cxx11::string::~string((string *)&local_1e8);
          cmListFileContext::~cmListFileContext((cmListFileContext *)&varresult);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variable);
        }
      }
      else {
        if (tVar3 == ENVIRONMENT) {
          pcVar10 = cmsys::SystemTools::GetEnv(local_290._M_dataplus._M_p);
        }
        else {
          if (tVar3 != CACHE) goto LAB_003449bd;
          pcVar10 = cmState::GetCacheEntryValue(this_00,&local_290);
        }
LAB_0034495f:
        if (pcVar10 == (char *)0x0) goto LAB_003449bd;
        if ((char)local_304 == '\0') {
          std::__cxx11::string::assign((char *)&varresult_1);
        }
        else {
          std::__cxx11::string::string((string *)&varresult,pcVar10,(allocator *)&converter);
          cmSystemTools::EscapeQuotes(&variable,&varresult);
          std::__cxx11::string::operator=((string *)&varresult_1,(string *)&variable);
          std::__cxx11::string::~string((string *)&variable);
          std::__cxx11::string::~string((string *)&varresult);
        }
      }
LAB_00344e8c:
      std::__cxx11::string::replace
                ((ulong)&result,uVar4,(string *)(result._M_string_length - uVar4));
      pcVar14 = (cmState *)&(pcVar13->PropertyDefinitions)._M_t._M_impl.field_0x1;
      std::__cxx11::string::~string((string *)&varresult_1);
      std::__cxx11::string::~string((string *)&local_290);
    }
LAB_00344ecb:
    if ((local_31c & 1) != 0) goto LAB_00344f7f;
    bVar15 = (pcVar13->PropertyDefinitions)._M_t._M_impl.field_0x1;
    pcVar13 = (cmState *)&(pcVar13->PropertyDefinitions)._M_t._M_impl.field_0x1;
  } while (bVar15 != 0);
  if (openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
      super__Vector_impl_data._M_start ==
      openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)&result);
    std::__cxx11::string::_M_assign((string *)local_220);
  }
  else {
    std::__cxx11::string::append((char *)local_328);
LAB_00344f7f:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&variable);
    std::operator<<((ostream *)&variable,"Syntax error in cmake code ");
    if (filename != (char *)0x0) {
      poVar12 = std::operator<<((ostream *)&variable,"at\n");
      poVar12 = std::operator<<(poVar12,"  ");
      poVar12 = std::operator<<(poVar12,filename);
      poVar12 = std::operator<<(poVar12,":");
      poVar12 = std::ostream::_M_insert<long>((long)poVar12);
      std::operator<<(poVar12,"\n");
    }
    poVar12 = std::operator<<((ostream *)&variable,"when parsing string\n");
    poVar12 = std::operator<<(poVar12,"  ");
    poVar12 = std::operator<<(poVar12,(string *)local_220);
    std::operator<<(poVar12,"\n");
    std::operator<<((ostream *)&variable,(string *)local_328);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_328,(string *)&varresult);
    std::__cxx11::string::~string((string *)&varresult);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variable);
    local_30c = FATAL_ERROR;
  }
  std::_Vector_base<t_lookup,_std::allocator<t_lookup>_>::~_Vector_base
            (&openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>);
  std::__cxx11::string::~string((string *)&result);
  return local_30c;
}

Assistant:

cmake::MessageType cmMakefile::ExpandVariablesInStringNew(
                                            std::string& errorstr,
                                            std::string& source,
                                            bool escapeQuotes,
                                            bool noEscapes,
                                            bool atOnly,
                                            const char* filename,
                                            long line,
                                            bool removeEmpty,
                                            bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::vector<t_lookup> openstack;
  bool error = false;
  bool done = false;
  cmake::MessageType mtype = cmake::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  do
    {
    char inc = *in;
    switch(inc)
      {
      case '}':
        if(!openstack.empty())
          {
          t_lookup var = openstack.back();
          openstack.pop_back();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          const char* value = NULL;
          std::string varresult;
          static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
          switch(var.domain)
            {
            case NORMAL:
              if(filename && lookup == lineVar)
                {
                std::ostringstream ostr;
                ostr << line;
                varresult = ostr.str();
                }
              else
                {
                value = this->GetDefinition(lookup);
                }
              break;
            case ENVIRONMENT:
              value = cmSystemTools::GetEnv(lookup.c_str());
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
            }
          // Get the string we're meant to append to.
          if(value)
            {
            if(escapeQuotes)
              {
              varresult = cmSystemTools::EscapeQuotes(value);
              }
            else
              {
              varresult = value;
              }
            }
          else if(!removeEmpty)
            {
            // check to see if we need to print a warning
            // if strict mode is on and the variable has
            // not been "cleared"/initialized with a set(foo ) call
            if(this->GetCMakeInstance()->GetWarnUninitialized() &&
               !this->VariableInitialized(lookup))
              {
              if (this->CheckSystemVars ||
                  cmSystemTools::IsSubDirectory(filename,
                                                this->GetHomeDirectory()) ||
                  cmSystemTools::IsSubDirectory(filename,
                                             this->GetHomeOutputDirectory()))
                {
                std::ostringstream msg;
                cmListFileContext lfc;
                cmOutputConverter converter(this->StateSnapshot);
                lfc.FilePath =
                    converter.Convert(filename, cmOutputConverter::HOME);
                lfc.Line = line;
                msg << "uninitialized variable \'" << lookup << "\'";
                this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                                       msg.str(), lfc);
                }
              }
            }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
          }
        break;
      case '$':
        if(!atOnly)
          {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = NULL;
          char nextc = *next;
          if(nextc == '{')
            {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
            }
          else if(nextc == '<')
            {
            }
          else if(!nextc)
            {
            result.append(last, next - last);
            last = next;
            }
          else if(cmHasLiteralPrefix(next, "ENV{"))
            {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
            }
          else if(cmHasLiteralPrefix(next, "CACHE{"))
            {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
            }
          else
            {
            if(this->cmNamedCurly.find(next))
              {
              errorstr = "Syntax $"
                  + std::string(next, this->cmNamedCurly.end())
                  + "{} is not supported.  Only ${}, $ENV{}, "
                    "and $CACHE{} are allowed.";
              mtype = cmake::FATAL_ERROR;
              error = true;
              }
            }
          if(start)
            {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push_back(lookup);
            }
          break;
          }
      case '\\':
        if(!noEscapes)
          {
          const char* next = in + 1;
          char nextc = *next;
          if(nextc == 't')
            {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
            }
          else if(nextc == 'n')
            {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
            }
          else if(nextc == 'r')
            {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
            }
          else if(nextc == ';' && openstack.empty())
            {
            // Handled in ExpandListArgument; pass the backslash literally.
            }
          else if (isalnum(nextc) || nextc == '\0')
            {
            errorstr += "Invalid character escape '\\";
            if (nextc)
              {
              errorstr += nextc;
              errorstr += "'.";
              }
            else
              {
              errorstr += "' (at end of input).";
              }
            error = true;
            }
          else
            {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
            }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if(*last)
            {
            ++in;
            }
          }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if(replaceAt)
          {
          const char* nextAt = strchr(in + 1, '@');
          if(nextAt && nextAt != in + 1 &&
             nextAt == in + 1 + strspn(in + 1,
                "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                "abcdefghijklmnopqrstuvwxyz"
                "0123456789/_.+-"))
            {
            std::string variable(in + 1, nextAt - in - 1);
            std::string varresult = this->GetSafeDefinition(variable);
            if(escapeQuotes)
              {
              varresult = cmSystemTools::EscapeQuotes(varresult);
              }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
            }
          }
        // Failed to find a valid @ expansion; treat it as literal.
        /* FALLTHROUGH */
      default:
        {
        if(!openstack.empty() &&
           !(isalnum(inc) || inc == '_' ||
             inc == '/' || inc == '.' ||
             inc == '+' || inc == '-'))
          {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" + result.substr(openstack.back().loc) + "'";
          mtype = cmake::FATAL_ERROR;
          error = true;
          }
        break;
        }
      }
    // Look at the next character.
    } while(!error && !done && *++in);

  // Check for open variable references yet.
  if(!error && !openstack.empty())
    {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
    }

  if(error)
    {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if(filename)
      {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
            << "  " << filename << ":" << line << "\n";
      }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = cmake::FATAL_ERROR;
    errorstr = emsg.str();
    }
  else
    {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
    }

  return mtype;
}